

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O0

int zt_ipv4_tbl_add_node(zt_ipv4_tbl *tbl,zt_ipv4_node *node)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  zt_mem_pool *pzVar4;
  void *__s;
  long *in_RSI;
  long in_RDI;
  zt_ipv4_node **hash_entry;
  int i;
  int is_in;
  uint8_t blen;
  uint32_t key;
  zt_mem_pool *pool;
  zt_ipv4_node *node_slot;
  uint in_stack_ffffffffffffffc8;
  int iVar5;
  int iVar6;
  char *in_stack_ffffffffffffffd8;
  int local_4;
  
  if ((in_RDI == 0) || (in_RSI == (long *)0x0)) {
    local_4 = -1;
  }
  else if (*(char *)in_RSI[1] == '\0') {
    *(long **)(in_RDI + 0x130) = in_RSI;
    local_4 = 0;
  }
  else {
    pzVar4 = zt_mem_pool_get(in_stack_ffffffffffffffd8);
    if (pzVar4 == (zt_mem_pool *)0x0) {
      local_4 = -1;
    }
    else {
      iVar6 = 0;
      bVar2 = *(char *)in_RSI[1] - 1;
      if (*(long *)(in_RDI + 8 + (ulong)bVar2 * 8) == 0) {
        __s = zt_mem_pool_alloc((zt_mem_pool *)(ulong)in_stack_ffffffffffffffc8);
        if (__s == (void *)0x0) {
          return -1;
        }
        memset(__s,0,(ulong)*(uint *)(in_RDI + 0x128) << 3);
        *(void **)(in_RDI + 8 + (ulong)bVar2 * 8) = __s;
      }
      uVar3 = *(uint *)(in_RSI[1] + 4) & *(int *)(in_RDI + 0x128) - 1U;
      lVar1 = *(long *)(*(long *)(in_RDI + 8 + (ulong)bVar2 * 8) + (ulong)uVar3 * 8);
      if (lVar1 != 0) {
        *in_RSI = lVar1;
      }
      *(long **)(*(long *)(in_RDI + 8 + (ulong)bVar2 * 8) + (ulong)uVar3 * 8) = in_RSI;
      iVar5 = 0;
      while( true ) {
        if ((0x1f < iVar5) || (*(char *)(in_RDI + 0x108 + (long)iVar5) == '\0')) goto LAB_00146afe;
        if (*(char *)(in_RDI + 0x108 + (long)iVar5) == *(char *)in_RSI[1]) break;
        iVar5 = iVar5 + 1;
      }
      iVar6 = 1;
LAB_00146afe:
      if (iVar6 == 0) {
        *(undefined1 *)(in_RDI + 0x108 + (long)iVar5) = *(undefined1 *)in_RSI[1];
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
zt_ipv4_tbl_add_node(zt_ipv4_tbl * tbl, zt_ipv4_node * node)
{
    zt_ipv4_node *node_slot;
    zt_mem_pool  *pool;
    uint32_t      key;
    uint8_t       blen;
    int           is_in;
    int           i;

    if (!tbl || !node) {
        return -1;
    }

    if (node->addr->bitlen == 0) {
        /*
         * this is a 0.0.0.0/0 network, set the any to this node
         */
        tbl->any = node;
        return 0;
    }

    if (!(pool = zt_mem_pool_get("zt_ipv4_node_hash"))) {
        return -1;
    }

    is_in = 0;
    blen = node->addr->bitlen - 1;

    if (tbl->tbl[blen] == NULL) {
        zt_ipv4_node **hash_entry;

        if (!(hash_entry = zt_mem_pool_alloc(pool))) {
            return -1;
        }

        memset(hash_entry, 0, sizeof(zt_ipv4_node *) * tbl->sz);

        tbl->tbl[blen] = hash_entry;
    }

    key = node->addr->addr & (tbl->sz - 1);
    node_slot = tbl->tbl[blen][key];

    if (node_slot != NULL) {
        node->next = node_slot;
    }

    tbl->tbl[blen][key] = node;

    /*
     * set our in array to this bitlen if it doesn't exist
     * we use this to iterate through the prefixes.
     *
     * For example if the bitlen is /32 and we add one node
     * tbl->in[0] would be 32.
     *
     * When we search for an address within our table the
     * only work we have to do is checking bitlengths found
     * within this in array
     */

    for (i = 0; i < 32; i++) {
        if (tbl->in[i] == 0) {
            break;
        }

        if (tbl->in[i] == node->addr->bitlen) {
            is_in = 1;
            break;
        }
    }

    /*
     * the bitlen doesn't exist, so add it to the last
     * open slot
     */
    if (is_in == 0) {
        tbl->in[i] = node->addr->bitlen;
    }

    return 0;
}